

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetBlend
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  DFlashFader *this;
  uint uVar8;
  AActor *who;
  char *pcVar9;
  uint uVar10;
  
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_003e5893;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e5883:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e5893:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe59,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  who = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (who == (AActor *)0x0) goto LAB_003e5722;
    bVar7 = DObject::IsKindOf((DObject *)who,AActor::RegistrationInfo.MyClass);
    if (!bVar7) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e5893;
    }
  }
  else {
    if (who != (AActor *)0x0) goto LAB_003e5883;
LAB_003e5722:
    who = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      if ((uint)numparam < 3) {
        pcVar9 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x01') {
          if (numparam == 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              uVar2 = param[1].field_0.i;
              dVar1 = param[2].field_0.f;
              iVar3 = param[3].field_0.i;
              if ((uint)numparam < 5) {
                param = defaultparam->Array;
                if (param[4].field_0.field_3.Type == '\0') goto LAB_003e57a3;
                pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
LAB_003e57a3:
                  uVar4 = param[4].field_0.i;
                  bVar7 = uVar2 == 0xffffffff;
                  uVar10 = uVar2 >> 0x10 & 0xff;
                  if (bVar7) {
                    uVar10 = 0;
                  }
                  uVar8 = uVar2 >> 8 & 0xff;
                  if (bVar7) {
                    uVar8 = 0;
                  }
                  uVar2 = uVar2 & 0xff;
                  if (bVar7) {
                    uVar2 = 0;
                  }
                  uVar5 = uVar4 >> 0x10;
                  uVar6 = uVar4 >> 8;
                  if (uVar4 + 1 < 0x1000001) {
                    uVar4 = uVar2;
                    uVar5 = uVar10;
                    uVar6 = uVar8;
                  }
                  this = (DFlashFader *)DObject::operator_new(0x68);
                  DFlashFader::DFlashFader
                            (this,(float)uVar10 / 255.0,(float)uVar8 / 255.0,(float)uVar2 / 255.0,
                             (float)dVar1,(float)(uVar5 & 0xff) / 255.0,
                             (float)(uVar6 & 0xff) / 255.0,(float)(uVar4 & 0xff) / 255.0,0.0,
                             (float)iVar3 / 35.0,who);
                  return 0;
                }
                pcVar9 = "(param[paramnum]).Type == REGT_INT";
              }
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0xe5d,
                            "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar9 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xe5c,
                        "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe5b,
                    "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar9 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe5a,
                "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetBlend)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_COLOR		(color);
	PARAM_FLOAT		(alpha);
	PARAM_INT		(tics);
	PARAM_COLOR_DEF	(color2);

	if (color == MAKEARGB(255,255,255,255))
		color = 0;
	if (color2 == MAKEARGB(255,255,255,255))
		color2 = 0;
	if (color2.a == 0)
		color2 = color;

	new DFlashFader(color.r/255.f, color.g/255.f, color.b/255.f, float(alpha),
					color2.r/255.f, color2.g/255.f, color2.b/255.f, 0,
					float(tics)/TICRATE, self);
	return 0;
}